

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  LogMessage *pLVar5;
  ulong uVar6;
  DescriptorProto *pDVar7;
  EnumDescriptorProto *this_00;
  FieldDescriptorProto *pFVar8;
  ServiceDescriptorProto *this_01;
  string_view sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string_view local_150;
  int local_13c;
  undefined1 local_138 [4];
  int i_3;
  string_view local_118;
  int local_104;
  undefined1 local_100 [4];
  int i_2;
  string_view local_e0;
  int local_d0;
  undefined4 local_cc;
  int i_1;
  string_view local_a8;
  int local_94;
  undefined1 local_90 [4];
  int i;
  string path;
  LogMessage local_58;
  Voidify local_41;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>,_bool>
  local_40;
  FileDescriptorProto *local_28;
  FileDescriptorProto *value_local;
  FileDescriptorProto *file_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_28 = value;
  value_local = file;
  file_local = (FileDescriptorProto *)this;
  psVar4 = FileDescriptorProto::name_abi_cxx11_(file);
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>>
  ::emplace<std::__cxx11::string_const&,google::protobuf::FileDescriptorProto_const*&>
            (&local_40,this,psVar4,&local_28);
  if (((local_40.second ^ 0xffU) & 1) == 0) {
    bVar2 = FileDescriptorProto::has_package(value_local);
    if (bVar2) {
      psVar4 = FileDescriptorProto::package_abi_cxx11_(value_local);
      std::__cxx11::string::string((string *)local_90,(string *)psVar4);
    }
    else {
      std::__cxx11::string::string((string *)local_90);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_90,'.');
    }
    local_94 = 0;
    while( true ) {
      iVar1 = local_94;
      iVar3 = FileDescriptorProto::message_type_size(value_local);
      if (iVar3 <= iVar1) break;
      pDVar7 = FileDescriptorProto::message_type(value_local,local_94);
      psVar4 = DescriptorProto::name_abi_cxx11_(pDVar7);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     psVar4);
      sVar9 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&i_1);
      local_a8 = sVar9;
      bVar2 = AddSymbol(this,sVar9,local_28);
      std::__cxx11::string::~string((string *)&i_1);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_003e097b;
      }
      psVar4 = FileDescriptorProto::name_abi_cxx11_(value_local);
      pDVar7 = FileDescriptorProto::message_type(value_local,local_94);
      bVar2 = AddNestedExtensions(this,psVar4,pDVar7,local_28);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_003e097b;
      }
      local_94 = local_94 + 1;
    }
    local_d0 = 0;
    while( true ) {
      iVar1 = local_d0;
      iVar3 = FileDescriptorProto::enum_type_size(value_local);
      if (iVar3 <= iVar1) break;
      this_00 = FileDescriptorProto::enum_type(value_local,local_d0);
      psVar4 = EnumDescriptorProto::name_abi_cxx11_(this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     psVar4);
      sVar9 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
      local_e0 = sVar9;
      bVar2 = AddSymbol(this,sVar9,local_28);
      std::__cxx11::string::~string((string *)local_100);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_003e097b;
      }
      local_d0 = local_d0 + 1;
    }
    local_104 = 0;
    while( true ) {
      iVar1 = local_104;
      iVar3 = FileDescriptorProto::extension_size(value_local);
      if (iVar3 <= iVar1) break;
      pFVar8 = FileDescriptorProto::extension(value_local,local_104);
      psVar4 = FieldDescriptorProto::name_abi_cxx11_(pFVar8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     psVar4);
      sVar9 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_138);
      local_118 = sVar9;
      bVar2 = AddSymbol(this,sVar9,local_28);
      std::__cxx11::string::~string((string *)local_138);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_003e097b;
      }
      psVar4 = FileDescriptorProto::name_abi_cxx11_(value_local);
      pFVar8 = FileDescriptorProto::extension(value_local,local_104);
      bVar2 = AddExtension(this,psVar4,pFVar8,local_28);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_003e097b;
      }
      local_104 = local_104 + 1;
    }
    local_13c = 0;
    while( true ) {
      iVar1 = local_13c;
      iVar3 = FileDescriptorProto::service_size(value_local);
      if (iVar3 <= iVar1) break;
      this_01 = FileDescriptorProto::service(value_local,local_13c);
      psVar4 = ServiceDescriptorProto::name_abi_cxx11_(this_01);
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     psVar4);
      sVar9 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_170);
      local_150 = sVar9;
      bVar2 = AddSymbol(this,sVar9,local_28);
      std::__cxx11::string::~string((string *)&local_170);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        goto LAB_003e097b;
      }
      local_13c = local_13c + 1;
    }
    this_local._7_1_ = 1;
LAB_003e097b:
    local_cc = 1;
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x7b);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(char (*) [34])"File already exists in database: ");
    psVar4 = FileDescriptorProto::name_abi_cxx11_(value_local);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,psVar4);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar5);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_58);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file, Value value) {
  if (!by_name_.emplace(file.name(), value).second) {
    ABSL_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  std::string path = file.has_package() ? file.package() : std::string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.name(), file.message_type(i), value))
      return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.name(), file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}